

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O1

int lj_ffh_tonumber(lua_State *L)

{
  byte *pbVar1;
  uint uVar2;
  TValue *o;
  CType *pCVar3;
  int32_t __base;
  StrScanFmt SVar4;
  GCstr *in_RAX;
  GCstr *pGVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 *puVar8;
  CTState *cts;
  undefined1 auVar9 [16];
  GCstr *local_28;
  
  __base = 10;
  local_28 = in_RAX;
  if ((L->base + 1 < L->top) && (*(int *)((long)L->base + 0xc) != -1)) {
    __base = lj_lib_checkint(L,2);
  }
  if (__base == 10) {
    o = L->base;
    if (L->top <= o) {
      lj_err_arg(L,1,LJ_ERR_NOVAL);
    }
    if (((o->field_2).it < 0xffff0000) ||
       (((o->field_2).it == 0xfffffffb &&
        (SVar4 = lj_strscan_scan((uint8_t *)((ulong)(o->u32).lo + 0x10),o,2), SVar4 != STRSCAN_ERROR
        )))) {
      L->base[-1].u32 = *(anon_struct_8_2_f9ee98fb_for_u32 *)o;
      return 2;
    }
    if ((o->field_2).it == 0xfffffff5) {
      cts = (CTState *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0xfc);
      cts->L = L;
      uVar6 = (ulong)*(ushort *)((ulong)(o->u32).lo + 6);
      pCVar3 = cts->tab;
      do {
        uVar7 = uVar6 * 0x10;
        uVar2 = pCVar3[uVar6].info;
        uVar6 = (ulong)(uVar2 & 0xffff);
      } while ((uVar2 & 0xf0800000) == 0x20800000);
      uVar6 = (ulong)((uVar2 & 0xffff) << 4);
      if ((uVar2 & 0xf0000000) != 0x50000000) {
        uVar6 = uVar7;
      }
      uVar2 = *(uint *)((long)&pCVar3->info + uVar6);
      if (uVar2 < 0x10000000 || (uVar2 & 0xf4000000) == 0x34000000) {
        lj_cconv_ct_tv(cts,pCVar3 + 0xe,(uint8_t *)&L->base[-1].u64,o,0);
        return 2;
      }
    }
  }
  else {
    pGVar5 = lj_lib_checkstr(L,1);
    if (__base - 0x25U < 0xffffffdd) {
      lj_err_arg(L,2,LJ_ERR_BASERNG);
    }
    uVar6 = strtoul((char *)(pGVar5 + 1),(char **)&local_28,__base);
    if (pGVar5 + 1 != local_28) {
      puVar8 = (undefined1 *)((long)&local_28[-1].len + 3);
      do {
        pbVar1 = puVar8 + 1;
        puVar8 = puVar8 + 1;
      } while ((""[(ulong)*pbVar1 + 1] & 2) != 0);
      if (*pbVar1 == 0) {
        auVar9._8_4_ = (int)(uVar6 >> 0x20);
        auVar9._0_8_ = uVar6;
        auVar9._12_4_ = 0x45300000;
        L->base[-1].n =
             (auVar9._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0);
        return 2;
      }
    }
  }
  *(undefined4 *)((long)L->base + -4) = 0xffffffff;
  return 2;
}

Assistant:

LJLIB_ASM(tonumber)		LJLIB_REC(.)
{
  int32_t base = lj_lib_optint(L, 2, 10);
  if (base == 10) {
    TValue *o = lj_lib_checkany(L, 1);
    if (lj_strscan_numberobj(o)) {
      copyTV(L, L->base-1, o);
      return FFH_RES(1);
    }
#if LJ_HASFFI
    if (tviscdata(o)) {
      CTState *cts = ctype_cts(L);
      CType *ct = lj_ctype_rawref(cts, cdataV(o)->ctypeid);
      if (ctype_isenum(ct->info)) ct = ctype_child(cts, ct);
      if (ctype_isnum(ct->info) || ctype_iscomplex(ct->info)) {
	if (LJ_DUALNUM && ctype_isinteger_or_bool(ct->info) &&
	    ct->size <= 4 && !(ct->size == 4 && (ct->info & CTF_UNSIGNED))) {
	  int32_t i;
	  lj_cconv_ct_tv(cts, ctype_get(cts, CTID_INT32), (uint8_t *)&i, o, 0);
	  setintV(L->base-1, i);
	  return FFH_RES(1);
	}
	lj_cconv_ct_tv(cts, ctype_get(cts, CTID_DOUBLE),
		       (uint8_t *)&(L->base-1)->n, o, 0);
	return FFH_RES(1);
      }
    }
#endif
  } else {
    const char *p = strdata(lj_lib_checkstr(L, 1));
    char *ep;
    unsigned long ul;
    if (base < 2 || base > 36)
      lj_err_arg(L, 2, LJ_ERR_BASERNG);
    ul = strtoul(p, &ep, base);
    if (p != ep) {
      while (lj_char_isspace((unsigned char)(*ep))) ep++;
      if (*ep == '\0') {
	if (LJ_DUALNUM && LJ_LIKELY(ul < 0x80000000u))
	  setintV(L->base-1, (int32_t)ul);
	else
	  setnumV(L->base-1, (lua_Number)ul);
	return FFH_RES(1);
      }
    }
  }
  setnilV(L->base-1);
  return FFH_RES(1);
}